

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double Alg::max_vector(vector<double,_std::allocator<double>_> *budget_list)

{
  bool bVar1;
  reference pdVar2;
  double i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double tmp;
  vector<double,_std::allocator<double>_> *budget_list_local;
  
  __range1 = (vector<double,_std::allocator<double>_> *)0x0;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(budget_list);
  i = (double)std::vector<double,_std::allocator<double>_>::end(budget_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    if ((double)__range1 < *pdVar2) {
      __range1 = (vector<double,_std::allocator<double>_> *)*pdVar2;
    }
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return (double)__range1;
}

Assistant:

double Alg::max_vector(const std::vector<double> & budget_list) {
    double tmp = WINT_MIN;
    for (double i : budget_list) {
        if (i > tmp) {
            tmp = i;
        }
    }
    return tmp;
}